

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getTags
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  bool bVar1;
  char *msg;
  Exception *in_RDI;
  uint64_t tag;
  uint8_t offset;
  uint8_t *start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *ret;
  Exception *this_00;
  byte local_21;
  byte *local_20;
  
  this_00 = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1268df);
  bVar1 = isTagged((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1268e9);
  if (bVar1) {
    local_20 = ptr((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1268fc);
    while (SliceStaticData::TypeMap[*local_20] == Tagged) {
      if (*local_20 == 0xee) {
        readIntegerFixed<unsigned_long,1ul>(local_20 + 1);
        local_21 = 2;
      }
      else {
        if (*local_20 != 0xef) {
          msg = (char *)__cxa_allocate_exception(0x18);
          Exception::Exception(this_00,(ExceptionType)((ulong)in_RDI >> 0x20),msg);
          __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
        }
        readIntegerFixed<unsigned_long,8ul>(local_20 + 1);
        local_21 = 9;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                 (value_type_conflict1 *)in_RDI);
      local_20 = local_20 + (int)(uint)local_21;
    }
  }
  return (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00;
}

Assistant:

std::vector<uint64_t> getTags() const {
    std::vector<uint64_t> ret;

    if (isTagged()) {
      // always need the actual first byte, so use ptr() directly
      uint8_t const* start = ptr();

      while (SliceStaticData::TypeMap[*start] == ValueType::Tagged) {
        uint8_t offset;
        uint64_t tag;

        if (*start == 0xee) {
          tag = readIntegerFixed<uint64_t, 1>(start + 1);
          offset = 2;
        } else if (*start == 0xef) {
          tag = readIntegerFixed<uint64_t, 8>(start + 1);
          offset = 9;
        } else {
          throw Exception(Exception::InternalError, "Invalid tag type ID");
        }

        ret.push_back(tag);
        start += offset;
      }
    }

    return ret;
  }